

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O3

void __thiscall VCWinDeployQtTool::~VCWinDeployQtTool(VCWinDeployQtTool *this)

{
  Data *pDVar1;
  
  (this->super_VCToolBase)._vptr_VCToolBase = (_func_int **)&PTR__VCWinDeployQtTool_002e28f8;
  pDVar1 = (this->CommandLine).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->CommandLine).d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->Record).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->Record).d.d)->super_QArrayData,2,0x10);
    }
  }
  operator_delete(this,0x48);
  return;
}

Assistant:

VCWinDeployQtTool() {}